

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_BufEdgeSlack(Buf_Man_t *p,Abc_Obj_t *pObj,Abc_Obj_t *pFan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Obj_t *pFan_local;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  iVar1 = p->DelayMax;
  iVar2 = Abc_BufNodeArr(p,pObj);
  iVar3 = Abc_BufNodeDep(p,pFan);
  iVar4 = Abc_NodeFindFanin(pFan,pObj);
  iVar4 = Abc_BufEdgeDelay(p,pFan,iVar4);
  return ((iVar1 - iVar2) - iVar3) - iVar4;
}

Assistant:

static inline int  Abc_BufEdgeSlack( Buf_Man_t * p, Abc_Obj_t * pObj, Abc_Obj_t * pFan ) { return p->DelayMax - Abc_BufNodeArr(p, pObj) - Abc_BufNodeDep(p, pFan) - Abc_BufEdgeDelay(p, pFan, Abc_NodeFindFanin(pFan, pObj)); }